

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::PushTextWrapPos(float wrap_pos_x)

{
  int *piVar1;
  ImVector<float> *pIVar2;
  int iVar3;
  ImGuiWindow *pIVar4;
  float *pfVar5;
  ImGuiContext *pIVar6;
  ImGuiContext *ctx;
  float *__dest;
  int iVar7;
  int iVar8;
  
  pIVar6 = GImGui;
  pIVar4 = GImGui->CurrentWindow;
  pIVar4->WriteAccessed = true;
  (pIVar4->DC).TextWrapPos = wrap_pos_x;
  iVar8 = (pIVar4->DC).TextWrapPosStack.Size;
  iVar3 = (pIVar4->DC).TextWrapPosStack.Capacity;
  if (iVar8 == iVar3) {
    iVar8 = iVar8 + 1;
    if (iVar3 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar3 / 2 + iVar3;
    }
    if (iVar8 < iVar7) {
      iVar8 = iVar7;
    }
    if (iVar3 < iVar8) {
      if (pIVar6 != (ImGuiContext *)0x0) {
        piVar1 = &(pIVar6->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (float *)(*GImAllocatorAllocFunc)((long)iVar8 << 2,GImAllocatorUserData);
      pfVar5 = (pIVar4->DC).TextWrapPosStack.Data;
      if (pfVar5 != (float *)0x0) {
        memcpy(__dest,pfVar5,(long)(pIVar4->DC).TextWrapPosStack.Size << 2);
        pfVar5 = (pIVar4->DC).TextWrapPosStack.Data;
        if ((pfVar5 != (float *)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(pfVar5,GImAllocatorUserData);
      }
      (pIVar4->DC).TextWrapPosStack.Data = __dest;
      (pIVar4->DC).TextWrapPosStack.Capacity = iVar8;
    }
  }
  (pIVar4->DC).TextWrapPosStack.Data[(pIVar4->DC).TextWrapPosStack.Size] = wrap_pos_x;
  pIVar2 = &(pIVar4->DC).TextWrapPosStack;
  pIVar2->Size = pIVar2->Size + 1;
  return;
}

Assistant:

bool ImGuiTextFilter::Draw(const char* label, float width)
{
    if (width != 0.0f)
        ImGui::SetNextItemWidth(width);
    bool value_changed = ImGui::InputText(label, InputBuf, IM_ARRAYSIZE(InputBuf));
    if (value_changed)
        Build();
    return value_changed;
}